

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowControl.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     ret_near<InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> instruction,Context *context)

{
  unsigned_short address;
  ImmediateT IVar1;
  uint16_t *puVar2;
  unsigned_short ip;
  Context *context_local;
  Instruction<false> instruction_local;
  
  context_local = (Context *)instruction;
  address = pop<unsigned_short,false,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                      (context);
  IVar1 = Instruction<false>::operand((Instruction<false> *)&context_local);
  puVar2 = PCCompatible::Registers::sp(&context->registers);
  *puVar2 = *puVar2 + IVar1;
  PCCompatible::FlowController::jump<unsigned_short>(&context->flow_controller,address);
  return;
}

Assistant:

void ret_near(
	InstructionT instruction,
	ContextT &context
) {
	const auto ip = pop<uint16_t, false>(context);
	context.registers.sp() += instruction.operand();
	context.flow_controller.template jump<uint16_t>(ip);
}